

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmGeneratorTarget.cxx
# Opt level: O3

bool __thiscall
cmGeneratorTarget::HasMacOSXRpathInstallNameDir(cmGeneratorTarget *this,string *config)

{
  cmMakefile *this_00;
  bool bVar1;
  bool bVar2;
  bool bVar3;
  TargetType TVar4;
  int iVar5;
  ImportInfo *pIVar6;
  long lVar7;
  size_t sVar8;
  cmake *this_01;
  char *pcVar9;
  string install_name;
  undefined1 local_1d0 [32];
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_1b0;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_1a0;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_190 [6];
  ios_base local_130 [264];
  
  bVar1 = cmTarget::IsImported(this->Target);
  if (bVar1) {
    pIVar6 = GetImportInfo(this,config);
    if (pIVar6 != (ImportInfo *)0x0) {
      if ((pIVar6->NoSOName == false) && ((pIVar6->SOName)._M_string_length != 0)) {
        bVar3 = false;
        lVar7 = std::__cxx11::string::find((char *)&pIVar6->SOName,0x4ff443,0);
        if (lVar7 != 0) {
          return false;
        }
      }
      else {
        local_1a0._8_8_ = 0;
        local_190[0]._M_local_buf[0] = '\0';
        local_1a0._M_allocated_capacity = (size_type)local_190;
        cmSystemTools::GuessLibraryInstallName(&pIVar6->Location,(string *)&local_1a0);
        lVar7 = std::__cxx11::string::find(local_1a0._M_local_buf,0x4f96bf,0);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_1a0._M_allocated_capacity != local_190) {
          operator_delete((void *)local_1a0._M_allocated_capacity,
                          CONCAT71(local_190[0]._M_allocated_capacity._1_7_,
                                   local_190[0]._M_local_buf[0]) + 1);
        }
        bVar3 = false;
        if (lVar7 == -1) {
          return false;
        }
      }
LAB_0028a260:
      this_00 = this->Makefile;
      local_1a0._M_allocated_capacity = (size_type)local_190;
      std::__cxx11::string::_M_construct<char_const*>
                ((string *)&local_1a0,"CMAKE_SHARED_LIBRARY_RUNTIME_C_FLAG","");
      bVar1 = cmMakefile::IsSet(this_00,(string *)&local_1a0);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_1a0._M_allocated_capacity != local_190) {
        operator_delete((void *)local_1a0._M_allocated_capacity,
                        CONCAT71(local_190[0]._M_allocated_capacity._1_7_,
                                 local_190[0]._M_local_buf[0]) + 1);
      }
      if (bVar1) {
        return true;
      }
      std::__cxx11::ostringstream::ostringstream((ostringstream *)local_1a0._M_local_buf);
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)&local_1a0,"Attempting to use ",0x12);
      pcVar9 = "@rpath";
      if (bVar3 != false) {
        pcVar9 = "MACOSX_RPATH";
      }
      lVar7 = 6;
      if (bVar3 != false) {
        lVar7 = 0xc;
      }
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)&local_1a0,pcVar9,lVar7);
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)&local_1a0," without CMAKE_SHARED_LIBRARY_RUNTIME_C_FLAG being set.",
                 0x37);
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)&local_1a0,"  This could be because you are using a Mac OS X version",
                 0x38);
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)&local_1a0,
                 " less than 10.5 or because CMake\'s platform configuration is",0x3c);
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)&local_1a0," corrupt.",9);
      this_01 = cmLocalGenerator::GetCMakeInstance(this->LocalGenerator);
      std::__cxx11::stringbuf::str();
      GetBacktrace((cmGeneratorTarget *)local_1d0);
      cmake::IssueMessage(this_01,FATAL_ERROR,(string *)(local_1d0 + 0x10),
                          (cmListFileBacktrace *)local_1d0);
      if ((cmMakefile *)local_1d0._8_8_ != (cmMakefile *)0x0) {
        std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                  ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_1d0._8_8_);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_1d0._16_8_ != &local_1b0) {
        operator_delete((void *)local_1d0._16_8_,(ulong)(local_1b0._M_allocated_capacity + 1));
      }
      std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_1a0._M_local_buf);
      std::ios_base::~ios_base(local_130);
      return true;
    }
  }
  else {
    TVar4 = cmTarget::GetType(this->Target);
    if (TVar4 == SHARED_LIBRARY) {
      local_1a0._M_allocated_capacity = (size_type)local_190;
      std::__cxx11::string::_M_construct<char_const*>((string *)&local_1a0,"INSTALL_NAME_DIR","");
      pcVar9 = GetProperty(this,(string *)&local_1a0);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_1a0._M_allocated_capacity != local_190) {
        operator_delete((void *)local_1a0._M_allocated_capacity,
                        CONCAT71(local_190[0]._M_allocated_capacity._1_7_,
                                 local_190[0]._M_local_buf[0]) + 1);
      }
      bVar2 = MacOSXUseInstallNameDir(this);
      bVar1 = pcVar9 == (char *)0x0;
      if (!bVar1 && bVar2) {
        local_1a0._M_allocated_capacity = (size_type)local_190;
        sVar8 = strlen(pcVar9);
        std::__cxx11::string::_M_construct<char_const*>((string *)&local_1a0,pcVar9,pcVar9 + sVar8);
        iVar5 = std::__cxx11::string::compare(local_1a0._M_local_buf);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_1a0._M_allocated_capacity != local_190) {
          operator_delete((void *)local_1a0._M_allocated_capacity,
                          CONCAT71(local_190[0]._M_allocated_capacity._1_7_,
                                   local_190[0]._M_local_buf[0]) + 1);
        }
        bVar3 = false;
        bVar1 = false;
        if (iVar5 == 0) goto LAB_0028a260;
      }
      if ((bVar1 || !bVar2) && (bVar3 = MacOSXRpathInstallNameDirDefault(this), bVar3))
      goto LAB_0028a260;
    }
  }
  return false;
}

Assistant:

bool cmGeneratorTarget::HasMacOSXRpathInstallNameDir(
  const std::string& config) const
{
  bool install_name_is_rpath = false;
  bool macosx_rpath = false;

  if (!this->IsImported()) {
    if (this->GetType() != cmStateEnums::SHARED_LIBRARY) {
      return false;
    }
    const char* install_name = this->GetProperty("INSTALL_NAME_DIR");
    bool use_install_name = this->MacOSXUseInstallNameDir();
    if (install_name && use_install_name &&
        std::string(install_name) == "@rpath") {
      install_name_is_rpath = true;
    } else if (install_name && use_install_name) {
      return false;
    }
    if (!install_name_is_rpath) {
      macosx_rpath = this->MacOSXRpathInstallNameDirDefault();
    }
  } else {
    // Lookup the imported soname.
    if (cmGeneratorTarget::ImportInfo const* info =
          this->GetImportInfo(config)) {
      if (!info->NoSOName && !info->SOName.empty()) {
        if (info->SOName.find("@rpath/") == 0) {
          install_name_is_rpath = true;
        }
      } else {
        std::string install_name;
        cmSystemTools::GuessLibraryInstallName(info->Location, install_name);
        if (install_name.find("@rpath") != std::string::npos) {
          install_name_is_rpath = true;
        }
      }
    }
  }

  if (!install_name_is_rpath && !macosx_rpath) {
    return false;
  }

  if (!this->Makefile->IsSet("CMAKE_SHARED_LIBRARY_RUNTIME_C_FLAG")) {
    std::ostringstream w;
    w << "Attempting to use ";
    if (macosx_rpath) {
      w << "MACOSX_RPATH";
    } else {
      w << "@rpath";
    }
    w << " without CMAKE_SHARED_LIBRARY_RUNTIME_C_FLAG being set.";
    w << "  This could be because you are using a Mac OS X version";
    w << " less than 10.5 or because CMake's platform configuration is";
    w << " corrupt.";
    cmake* cm = this->LocalGenerator->GetCMakeInstance();
    cm->IssueMessage(MessageType::FATAL_ERROR, w.str(), this->GetBacktrace());
  }

  return true;
}